

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void __thiscall
CVmObjBigNum::restore_from_file
          (CVmObjBigNum *this,vm_obj_id_t param_2,CVmFile *fp,CVmObjFixup *param_4)

{
  uint uVar1;
  CVmVarHeap *pCVar2;
  char *buf;
  size_t in_RDX;
  CVmFile *in_RDI;
  size_t prec;
  size_t in_stack_ffffffffffffffb8;
  CVmFile *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  
  uVar1 = CVmFile::read_uint2(in_stack_ffffffffffffffc0);
  if ((char *)in_RDI->seek_base_ != (char *)0x0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,(char *)in_RDI->seek_base_);
    in_RDI->seek_base_ = 0;
  }
  alloc_bignum((CVmObjBigNum *)in_RDI,in_stack_ffffffffffffffc8);
  set_prec((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  buf = (char *)in_RDI->seek_base_ + 2;
  calc_alloc((ulong)uVar1);
  CVmFile::read_bytes(in_RDI,buf,in_RDX);
  return;
}

Assistant:

void CVmObjBigNum::restore_from_file(VMG_ vm_obj_id_t,
                                     CVmFile *fp, CVmObjFixup *)
{
    size_t prec;
    
    /* read the precision */
    prec = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate the space */
    alloc_bignum(vmg_ prec);

    /* store our precision */
    set_prec(ext_, prec);

    /* read the contents */
    fp->read_bytes(ext_ + VMBN_EXP, calc_alloc(prec) - VMBN_EXP);
}